

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_png.cpp
# Opt level: O0

void __thiscall PNGHandle::~PNGHandle(PNGHandle *this)

{
  uint uVar1;
  char **ppcVar2;
  uint local_14;
  uint i;
  PNGHandle *this_local;
  
  for (local_14 = 0; uVar1 = TArray<char_*,_char_*>::Size(&this->TextChunks), local_14 < uVar1;
      local_14 = local_14 + 1) {
    ppcVar2 = TArray<char_*,_char_*>::operator[](&this->TextChunks,(ulong)local_14);
    if (*ppcVar2 != (char *)0x0) {
      operator_delete__(*ppcVar2);
    }
  }
  if (((this->bDeleteFilePtr & 1U) != 0) && (this->File != (FileReader *)0x0)) {
    (*(this->File->super_FileReaderBase)._vptr_FileReaderBase[1])();
  }
  TArray<char_*,_char_*>::~TArray(&this->TextChunks);
  TArray<PNGHandle::Chunk,_PNGHandle::Chunk>::~TArray(&this->Chunks);
  return;
}

Assistant:

PNGHandle::~PNGHandle ()
{
	for (unsigned int i = 0; i < TextChunks.Size(); ++i)
	{
		delete[] TextChunks[i];
	}
	if (bDeleteFilePtr)
	{
		delete File;
	}
}